

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O1

NodePtr __thiscall avro::makeNode(avro *this,Entity *e,SymbolTable *st,string *ns)

{
  EntityType EVar1;
  element_type *peVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
  *p_Var3;
  pointer pcVar4;
  undefined8 uVar5;
  _func_int **pp_Var6;
  undefined8 uVar7;
  undefined8 uVar8;
  pointer psVar9;
  pointer psVar10;
  undefined8 this_00;
  int iVar11;
  Node *__tmp;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *psVar12;
  shared_ptr<std::vector<avro::json::Entity,_std::allocator<avro::json::Entity>_>_> *psVar13;
  NodeUnion *this_01;
  shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>_>
  *psVar14;
  string *psVar15;
  long lVar16;
  string *simpleName;
  iterator iVar17;
  NodeSymbolic *this_02;
  int64_t iVar18;
  NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::NoAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::SingleAttribute<int>_>
  *this_03;
  NodeRecord *pNVar19;
  const_iterator cVar20;
  const_iterator cVar21;
  mapped_type *pmVar22;
  Exception *pEVar23;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar24;
  sp_counted_base *extraout_RDX;
  _Rb_tree_header *p_Var25;
  sp_counted_base *extraout_RDX_00;
  shared_count sVar26;
  pointer pEVar27;
  pointer *this_04;
  NodePtr NVar28;
  SingleAttribute<int> n_1;
  NodePtr result;
  Name n;
  NodePtr result_1;
  GenericDatum d;
  MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  fieldNames;
  MultiAttribute<boost::shared_ptr<avro::Node>_> mm;
  vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_> defaultValues;
  NodePtr r;
  undefined1 local_230 [16];
  undefined1 local_220 [40];
  MultiLeaves local_1f8;
  Name local_1d8;
  long local_198;
  shared_count local_190;
  Type local_188 [2];
  _Base_ptr local_180;
  put_holder<char,_std::char_traits<char>_> local_178;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  _Alloc_hider local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128 [11];
  GenericDatum local_78;
  NodePtr local_68;
  vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_> local_58;
  shared_ptr<avro::Node> local_40;
  
  EVar1 = e->type_;
  local_220._16_8_ = this;
  local_220._24_8_ = ns;
  if (EVar1 == etObject) {
    local_220._32_8_ = st;
    json::Entity::ensureType(e,etObject);
    psVar14 = boost::
              any_cast<boost::shared_ptr<std::map<std::__cxx11::string,avro::json::Entity,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,avro::json::Entity>>>>>
                        (&e->value_);
    p_Var3 = &psVar14->px->_M_t;
    local_158._8_8_ = (pointer)0x4;
    local_148._0_5_ = 0x65707974;
    local_158._0_8_ =
         (NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
          *)local_148;
    psVar15 = getStringField(e,(Object *)p_Var3,(string *)local_158);
    if ((NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
         *)local_158._0_8_ !=
        (NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
         *)local_148) {
      operator_delete((void *)local_158._0_8_,(ulong)(local_148._0_8_ + 1));
    }
    makePrimitive((avro *)&local_198,psVar15);
    sVar26.pi_ = local_190.pi_;
    if (local_198 == 0) {
      iVar11 = std::__cxx11::string::compare((char *)psVar15);
      if (iVar11 != 0) {
        iVar11 = std::__cxx11::string::compare((char *)psVar15);
        if (iVar11 != 0) {
          iVar11 = std::__cxx11::string::compare((char *)psVar15);
          if (iVar11 != 0) {
            iVar11 = std::__cxx11::string::compare((char *)psVar15);
            if (iVar11 != 0) {
              iVar11 = std::__cxx11::string::compare((char *)psVar15);
              if (iVar11 == 0) {
                makeArrayNode((Entity *)local_220._16_8_,(Object *)e,(SymbolTable *)p_Var3,
                              (string *)local_220._32_8_);
              }
              else {
                iVar11 = std::__cxx11::string::compare((char *)psVar15);
                if (iVar11 != 0) {
                  boost::detail::shared_count::~shared_count(&local_190);
                  pEVar23 = (Exception *)__cxa_allocate_exception(0x18);
                  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::
                  basic_format((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_158,"Unknown type definition: %1%");
                  json::Entity::toString_abi_cxx11_(&local_1d8.ns_,e);
                  local_230._8_8_ =
                       boost::io::detail::
                       call_put_head<char,std::char_traits<char>,std::__cxx11::string_const>;
                  local_220._0_8_ =
                       boost::io::detail::
                       call_put_last<char,std::char_traits<char>,std::__cxx11::string_const>;
                  local_230._0_8_ = &local_1d8;
                  pbVar24 = boost::io::detail::
                            feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                                      ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_158,
                                       (put_holder<char,_std::char_traits<char>_> *)local_230);
                  Exception::Exception(pEVar23,pbVar24);
                  __cxa_throw(pEVar23,&Exception::typeinfo,Exception::~Exception);
                }
                makeMapNode((Entity *)local_220._16_8_,(Object *)e,(SymbolTable *)p_Var3,
                            (string *)local_220._32_8_);
              }
              goto LAB_00154946;
            }
          }
        }
      }
      local_158._8_8_ = (pointer)0x4;
      local_148._0_5_ = 0x656d616e;
      local_158._0_8_ = (pointer)local_148;
      simpleName = getStringField(e,(Object *)p_Var3,(string *)local_158);
      if ((pointer)local_158._0_8_ != (pointer)local_148) {
        operator_delete((void *)local_158._0_8_,(ulong)(local_148._0_8_ + 1));
      }
      lVar16 = std::__cxx11::string::find((char)simpleName,0x2e);
      if (lVar16 == -1) {
        local_148._0_8_ = (pointer)0x63617073656d616e;
        local_148._8_2_ = 0x65;
        local_158._8_8_ = (pointer)0x9;
        local_158._0_8_ = (pointer)local_148;
        cVar21 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
                 ::find(p_Var3,(key_type *)local_158);
        if ((pointer)local_158._0_8_ != (pointer)local_148) {
          operator_delete((void *)local_158._0_8_,(ulong)(local_148._0_8_ + 1));
        }
        if ((_Rb_tree_header *)cVar21._M_node != &(p_Var3->_M_impl).super__Rb_tree_header) {
          if (cVar21._M_node[2]._M_color != 4) {
            pEVar23 = (Exception *)__cxa_allocate_exception(0x18);
            boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                      ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_158,"Json field \"%1%\" is not a %2%: %3%");
            local_230._0_8_ = "namespace";
            local_230._8_8_ =
                 boost::io::detail::call_put_head<char,std::char_traits<char>,char_const[10]>;
            local_220._0_8_ =
                 boost::io::detail::call_put_last<char,std::char_traits<char>,char_const[10]>;
            pbVar24 = boost::io::detail::
                      feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                                ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_158,(put_holder<char,_std::char_traits<char>_> *)local_230
                                );
            local_230._0_8_ = &local_1f8;
            local_1f8.attrs_.
            super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)((long)"std::string" + 5);
            local_230._8_8_ =
                 boost::io::detail::call_put_head<char,std::char_traits<char>,char_const*const>;
            local_220._0_8_ =
                 boost::io::detail::call_put_last<char,std::char_traits<char>,char_const*const>;
            pbVar24 = boost::io::detail::
                      feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                                (pbVar24,(put_holder<char,_std::char_traits<char>_> *)local_230);
            json::Entity::toString_abi_cxx11_((string *)local_230,(Entity *)(cVar21._M_node + 2));
            local_178.put_head =
                 boost::io::detail::
                 call_put_head<char,std::char_traits<char>,std::__cxx11::string_const>;
            local_178.put_last =
                 boost::io::detail::
                 call_put_last<char,std::char_traits<char>,std::__cxx11::string_const>;
            local_178.arg = (_Base_ptr)local_230;
            pbVar24 = boost::io::detail::
                      feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                                (pbVar24,&local_178);
            Exception::Exception(pEVar23,pbVar24);
            __cxa_throw(pEVar23,&Exception::typeinfo,Exception::~Exception);
          }
          json::Entity::ensureType((Entity *)(cVar21._M_node + 2),etString);
          psVar12 = boost::any_cast<boost::shared_ptr<std::__cxx11::string>>
                              ((any *)&cVar21._M_node[2]._M_parent);
          local_220._24_8_ = psVar12->px;
        }
        Name::Name(&local_1d8,simpleName,(string *)local_220._24_8_);
      }
      else {
        Name::Name(&local_1d8,simpleName);
      }
      *(undefined8 *)local_220._16_8_ = 0;
      *(undefined8 *)(local_220._16_8_ + 8) = 0;
      iVar11 = std::__cxx11::string::compare((char *)psVar15);
      if (iVar11 == 0) {
LAB_00154339:
        pNVar19 = (NodeRecord *)operator_new(0xd0);
        (pNVar19->super_NodeImplRecord).super_Node.type_ = AVRO_RECORD;
        (pNVar19->super_NodeImplRecord).super_Node.locked_ = false;
        (pNVar19->super_NodeImplRecord).nameAttribute_.attr_.ns_._M_dataplus._M_p =
             (pointer)&(pNVar19->super_NodeImplRecord).nameAttribute_.attr_.ns_.field_2;
        (pNVar19->super_NodeImplRecord).nameAttribute_.attr_.ns_._M_string_length = 0;
        (pNVar19->super_NodeImplRecord).nameAttribute_.attr_.ns_.field_2._M_local_buf[0] = '\0';
        (pNVar19->super_NodeImplRecord).nameAttribute_.attr_.simpleName_._M_dataplus._M_p =
             (pointer)&(pNVar19->super_NodeImplRecord).nameAttribute_.attr_.simpleName_.field_2;
        (pNVar19->super_NodeImplRecord).nameAttribute_.attr_.simpleName_._M_string_length = 0;
        (pNVar19->super_NodeImplRecord).nameAttribute_.attr_.simpleName_.field_2._M_local_buf[0] =
             '\0';
        p_Var25 = &(pNVar19->super_NodeImplRecord).nameIndex_.map_._M_t._M_impl.
                   super__Rb_tree_header;
        (pNVar19->super_NodeImplRecord).nameIndex_.map_._M_t._M_impl.super__Rb_tree_header._M_header
        ._M_color = _S_red;
        (pNVar19->super_NodeImplRecord).nameIndex_.map_._M_t._M_impl.super__Rb_tree_header._M_header
        ._M_parent = (_Base_ptr)0x0;
        (pNVar19->super_NodeImplRecord).leafAttributes_.attrs_.
        super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pNVar19->super_NodeImplRecord).leafAttributes_.attrs_.
        super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pNVar19->super_NodeImplRecord).leafAttributes_.attrs_.
        super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pNVar19->super_NodeImplRecord).leafNameAttributes_.attrs_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pNVar19->super_NodeImplRecord).leafNameAttributes_.attrs_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pNVar19->super_NodeImplRecord).leafNameAttributes_.attrs_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pNVar19->super_NodeImplRecord).nameIndex_.map_._M_t._M_impl.super__Rb_tree_header._M_header
        ._M_left = &p_Var25->_M_header;
        (pNVar19->super_NodeImplRecord).nameIndex_.map_._M_t._M_impl.super__Rb_tree_header._M_header
        ._M_right = &p_Var25->_M_header;
        (pNVar19->super_NodeImplRecord).nameIndex_.map_._M_t._M_impl.super__Rb_tree_header.
        _M_node_count = 0;
        (pNVar19->super_NodeImplRecord).super_Node._vptr_Node =
             (_func_int **)&PTR__NodeRecord_00192df8;
        (pNVar19->defaultValues).
        super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pNVar19->defaultValues).
        super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pNVar19->defaultValues).
        super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        boost::shared_ptr<avro::Node>::shared_ptr<avro::NodeRecord>
                  ((shared_ptr<avro::Node> *)local_230,pNVar19);
        uVar8 = local_220._16_8_;
        uVar7 = local_230._8_8_;
        uVar5 = local_230._0_8_;
        local_230._0_8_ =
             (NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
              *)0x0;
        local_230._8_8_ = (_Base_ptr)0x0;
        local_158._0_8_ = *(undefined8 *)local_220._16_8_;
        local_158._8_8_ = *(undefined8 *)(local_220._16_8_ + 8);
        *(undefined8 *)local_220._16_8_ = uVar5;
        *(undefined8 *)(local_220._16_8_ + 8) = uVar7;
        boost::detail::shared_count::~shared_count((shared_count *)(local_158 + 8));
        boost::detail::shared_count::~shared_count((shared_count *)(local_230 + 8));
        pmVar22 = std::
                  map<avro::Name,_boost::shared_ptr<avro::Node>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
                  ::operator[]((map<avro::Name,_boost::shared_ptr<avro::Node>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
                                *)local_220._32_8_,&local_1d8);
        boost::shared_ptr<avro::Node>::operator=(pmVar22,(shared_ptr<avro::Node> *)uVar8);
        local_158._8_8_ = (pointer)0x6;
        local_148._0_7_ = 0x73646c656966;
        local_158._0_8_ =
             (NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
              *)local_148;
        local_220._24_8_ = getArrayField(e,(Object *)p_Var3,(string *)local_158);
        if ((NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
             *)local_158._0_8_ !=
            (NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
             *)local_148) {
          operator_delete((void *)local_158._0_8_,(ulong)(local_148._0_8_ + 1));
        }
        local_178.put_last =
             (_func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_void_ptr *)0x0;
        local_178.arg = (_Base_ptr)0x0;
        local_178.put_head =
             (_func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_void_ptr *)0x0;
        local_1f8.attrs_.
        super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1f8.attrs_.
        super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1f8.attrs_.
        super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_58.super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_58.super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        local_58.super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        pEVar27 = (((_Vector_base<avro::json::Entity,_std::allocator<avro::json::Entity>_> *)
                   local_220._24_8_)->_M_impl).super__Vector_impl_data._M_start;
        if (pEVar27 != *(pointer *)(local_220._24_8_ + 8)) {
          do {
            json::Entity::ensureType(pEVar27,etObject);
            psVar14 = boost::
                      any_cast<boost::shared_ptr<std::map<std::__cxx11::string,avro::json::Entity,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,avro::json::Entity>>>>>
                                (&pEVar27->value_);
            p_Var3 = &psVar14->px->_M_t;
            local_230._8_8_ = (sp_counted_base *)0x4;
            local_220._0_5_ = 0x656d616e;
            local_230._0_8_ =
                 (NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
                  *)local_220;
            psVar15 = getStringField(pEVar27,(Object *)p_Var3,(string *)local_230);
            if ((NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
                 *)local_230._0_8_ !=
                (NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
                 *)local_220) {
              operator_delete((void *)local_230._0_8_,local_220._0_8_ + 1);
            }
            local_230._8_8_ = (sp_counted_base *)0x4;
            local_220._0_5_ = 0x65707974;
            local_230._0_8_ =
                 (NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
                  *)local_220;
            cVar20 = findField(pEVar27,(Object *)p_Var3,(string *)local_230);
            if ((NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
                 *)local_230._0_8_ !=
                (NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
                 *)local_220) {
              operator_delete((void *)local_230._0_8_,local_220._0_8_ + 1);
            }
            local_220._0_8_ = (_func_int **)0x746c7561666564;
            local_230._8_8_ = (_Base_ptr)0x7;
            local_230._0_8_ =
                 (NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
                  *)local_220;
            cVar21 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
                     ::find(p_Var3,(key_type *)local_230);
            if ((NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
                 *)local_230._0_8_ !=
                (NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
                 *)local_220) {
              operator_delete((void *)local_230._0_8_,local_220._0_8_ + 1);
            }
            makeNode((avro *)local_230,(Entity *)(cVar20._M_node + 2),
                     (SymbolTable *)local_220._32_8_,&local_1d8.ns_);
            p_Var25 = &(p_Var3->_M_impl).super__Rb_tree_header;
            if ((_Rb_tree_header *)cVar21._M_node == p_Var25) {
              local_188[0] = AVRO_NULL;
              local_180 = (_Base_ptr)0x0;
            }
            else {
              local_68.px = (element_type *)local_230._0_8_;
              local_68.pn.pi_ = (sp_counted_base *)local_230._8_8_;
              if ((_Base_ptr)local_230._8_8_ != (_Base_ptr)0x0) {
                LOCK();
                *(int *)(local_230._8_8_ + 8) = *(int *)(local_230._8_8_ + 8) + 1;
                UNLOCK();
              }
              makeGenericDatum((avro *)local_188,&local_68,(Entity *)(cVar21._M_node + 2),
                               (SymbolTable *)local_220._32_8_);
            }
            if ((_Rb_tree_header *)cVar21._M_node != p_Var25) {
              boost::detail::shared_count::~shared_count(&local_68.pn);
            }
            local_78.type_ = local_188[0];
            if (local_180 == (_Base_ptr)0x0) {
              local_78.value_.content = (placeholder *)0x0;
            }
            else {
              local_78.value_.content = (placeholder *)(**(code **)(*(long *)local_180 + 0x18))();
            }
            Field::Field((Field *)local_158,psVar15,(NodePtr *)local_230,&local_78);
            if (local_78.value_.content != (placeholder *)0x0) {
              (*(local_78.value_.content)->_vptr_placeholder[1])();
            }
            if (local_180 != (_Base_ptr)0x0) {
              (**(code **)(*(long *)local_180 + 8))();
            }
            boost::detail::shared_count::~shared_count((shared_count *)(local_230 + 8));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_178,(value_type *)local_158._0_8_);
            std::
            vector<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>::
            push_back(&local_1f8.attrs_,(value_type *)(local_158 + 8));
            std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>::push_back
                      (&local_58,(value_type *)(local_148 + 8));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              (**(code **)(*(size_type *)local_138._M_p + 8))();
            }
            boost::detail::shared_count::~shared_count((shared_count *)local_148);
            pEVar27 = pEVar27 + 1;
          } while (pEVar27 != *(pointer *)(local_220._24_8_ + 8));
        }
        pNVar19 = (NodeRecord *)operator_new(0xd0);
        asSingleAttribute<avro::Name>((SingleAttribute<avro::Name> *)local_158,&local_1d8);
        NodeRecord::NodeRecord
                  (pNVar19,(HasName *)local_158,&local_1f8,(LeafNames *)&local_178,&local_58);
        boost::shared_ptr<avro::Node>::shared_ptr<avro::NodeRecord>(&local_40,pNVar19);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_p != local_128) {
          operator_delete(local_138._M_p,local_128[0]._M_allocated_capacity + 1);
        }
        if ((NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
             *)local_158._0_8_ !=
            (NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
             *)local_148) {
          operator_delete((void *)local_158._0_8_,(ulong)(local_148._0_8_ + 1));
        }
        std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>::~vector(&local_58);
        std::vector<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
        ::~vector(&local_1f8.attrs_);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_178);
        boost::dynamic_pointer_cast<avro::NodeRecord,avro::Node>((boost *)local_158,&local_40);
        this_00 = local_158._0_8_;
        boost::dynamic_pointer_cast<avro::NodeRecord,avro::Node>
                  ((boost *)local_230,(shared_ptr<avro::Node> *)local_220._16_8_);
        uVar8 = local_230._0_8_;
        NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
        ::swap((NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
                *)this_00,
               (NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
                *)local_230._0_8_);
        pcVar4 = (((SingleAttribute<avro::Name> *)(this_00 + 200))->attr_).ns_._M_dataplus._M_p;
        uVar5 = *(undefined8 *)(uVar8 + 0xc0);
        pp_Var6 = (((NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
                     *)(this_00 + 0xb8))->super_Node)._vptr_Node;
        uVar7 = *(undefined8 *)(this_00 + 0xc0);
        (((NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
           *)(this_00 + 0xb8))->super_Node)._vptr_Node =
             (((NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
                *)(uVar8 + 0xb8))->super_Node)._vptr_Node;
        *(undefined8 *)(this_00 + 0xc0) = uVar5;
        (((SingleAttribute<avro::Name> *)(this_00 + 200))->attr_).ns_._M_dataplus._M_p =
             (((SingleAttribute<avro::Name> *)(uVar8 + 200))->attr_).ns_._M_dataplus._M_p;
        (((NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
           *)(uVar8 + 0xb8))->super_Node)._vptr_Node = pp_Var6;
        *(undefined8 *)(uVar8 + 0xc0) = uVar7;
        (((SingleAttribute<avro::Name> *)(uVar8 + 200))->attr_).ns_._M_dataplus._M_p = pcVar4;
        boost::detail::shared_count::~shared_count((shared_count *)(local_230 + 8));
        boost::detail::shared_count::~shared_count((shared_count *)(local_158 + 8));
        boost::detail::shared_count::~shared_count(&local_40.pn);
      }
      else {
        iVar11 = std::__cxx11::string::compare((char *)psVar15);
        if (iVar11 == 0) goto LAB_00154339;
        iVar11 = std::__cxx11::string::compare((char *)psVar15);
        if (iVar11 == 0) {
          makeEnumNode((avro *)&local_1f8,e,&local_1d8,(Object *)p_Var3);
          psVar15 = (string *)local_220._32_8_;
        }
        else {
          local_158._8_8_ = (pointer)0x4;
          local_148._0_5_ = 0x657a6973;
          local_158._0_8_ = (pointer)local_148;
          iVar18 = getLongField(e,(Object *)p_Var3,(string *)local_158);
          if ((pointer)local_158._0_8_ != (pointer)local_148) {
            operator_delete((void *)local_158._0_8_,(ulong)(local_148._0_8_ + 1));
          }
          if ((int)iVar18 < 1) {
            pEVar23 = (Exception *)__cxa_allocate_exception(0x18);
            boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                      ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_158,"Size for fixed is not positive: ");
            json::Entity::toString_abi_cxx11_((string *)local_230,e);
            local_178.put_head =
                 boost::io::detail::
                 call_put_head<char,std::char_traits<char>,std::__cxx11::string_const>;
            local_178.put_last =
                 boost::io::detail::
                 call_put_last<char,std::char_traits<char>,std::__cxx11::string_const>;
            local_178.arg = (_Base_ptr)local_230;
            pbVar24 = boost::io::detail::
                      feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                                ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_158,&local_178);
            Exception::Exception(pEVar23,pbVar24);
            __cxa_throw(pEVar23,&Exception::typeinfo,Exception::~Exception);
          }
          this_03 = (NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::NoAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::SingleAttribute<int>_>
                     *)operator_new(0x60);
          asSingleAttribute<avro::Name>((SingleAttribute<avro::Name> *)local_158,&local_1d8);
          local_230._0_4_ = (int)iVar18;
          NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::NoAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::SingleAttribute<int>_>
          ::NodeImpl(this_03,AVRO_FIXED,(SingleAttribute<avro::Name> *)local_158,
                     (NoAttribute<boost::shared_ptr<avro::Node>_> *)&local_178,
                     (NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_58,(SingleAttribute<int> *)local_230);
          (this_03->super_Node)._vptr_Node = (_func_int **)&PTR__NodeImpl_00193208;
          boost::shared_ptr<avro::Node>::shared_ptr<avro::NodeFixed>
                    ((shared_ptr<avro::Node> *)&local_1f8,(NodeFixed *)this_03);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_p != local_128) {
            operator_delete(local_138._M_p,local_128[0]._M_allocated_capacity + 1);
          }
          psVar15 = (string *)local_220._32_8_;
          if ((pointer)local_158._0_8_ != (pointer)local_148) {
            operator_delete((void *)local_158._0_8_,(ulong)(local_148._0_8_ + 1));
          }
        }
        psVar10 = local_1f8.attrs_.
                  super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        psVar9 = local_1f8.attrs_.
                 super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar5 = local_220._16_8_;
        local_1f8.attrs_.
        super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1f8.attrs_.
        super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_158._0_8_ = *(undefined8 *)local_220._16_8_;
        local_158._8_8_ = *(undefined8 *)(local_220._16_8_ + 8);
        *(pointer *)local_220._16_8_ = psVar9;
        *(pointer *)(local_220._16_8_ + 8) = psVar10;
        boost::detail::shared_count::~shared_count((shared_count *)(local_158 + 8));
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &local_1f8.attrs_.
                    super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        pmVar22 = std::
                  map<avro::Name,_boost::shared_ptr<avro::Node>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
                  ::operator[]((map<avro::Name,_boost::shared_ptr<avro::Node>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
                                *)psVar15,&local_1d8);
        boost::shared_ptr<avro::Node>::operator=(pmVar22,(shared_ptr<avro::Node> *)uVar5);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8.simpleName_._M_dataplus._M_p != &local_1d8.simpleName_.field_2) {
        operator_delete(local_1d8.simpleName_._M_dataplus._M_p,
                        local_1d8.simpleName_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8.ns_._M_dataplus._M_p != &local_1d8.ns_.field_2) {
        operator_delete(local_1d8.ns_._M_dataplus._M_p,
                        local_1d8.ns_.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      *(long *)local_220._16_8_ = local_198;
      *(undefined8 *)(local_220._16_8_ + 8) = 0;
      local_190.pi_ = (sp_counted_base *)0x0;
      *(sp_counted_base **)(local_220._16_8_ + 8) = sVar26.pi_;
      local_198 = 0;
    }
LAB_00154946:
    this_04 = (pointer *)&local_190;
  }
  else {
    if (EVar1 == etArray) {
      json::Entity::ensureType(e,etArray);
      psVar13 = boost::
                any_cast<boost::shared_ptr<std::vector<avro::json::Entity,std::allocator<avro::json::Entity>>>>
                          (&e->value_);
      peVar2 = psVar13->px;
      local_158._0_8_ = (pointer)0x0;
      local_158._8_8_ = (pointer)0x0;
      local_148._0_8_ = (pointer)0x0;
      pEVar27 = (peVar2->super__Vector_base<avro::json::Entity,_std::allocator<avro::json::Entity>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (pEVar27 !=
          (peVar2->super__Vector_base<avro::json::Entity,_std::allocator<avro::json::Entity>_>).
          _M_impl.super__Vector_impl_data._M_finish) {
        do {
          makeNode((avro *)&local_1d8,pEVar27,st,(string *)local_220._24_8_);
          std::
          vector<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>::
          push_back((vector<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
                     *)local_158,(value_type *)&local_1d8);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)&local_1d8.ns_._M_string_length);
          pEVar27 = pEVar27 + 1;
        } while (pEVar27 !=
                 (peVar2->
                 super__Vector_base<avro::json::Entity,_std::allocator<avro::json::Entity>_>).
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      this_01 = (NodeUnion *)operator_new(0x30);
      NodeUnion::NodeUnion(this_01,(MultiLeaves *)local_158);
      boost::shared_ptr<avro::Node>::shared_ptr<avro::NodeUnion>
                ((shared_ptr<avro::Node> *)local_220._16_8_,this_01);
      std::vector<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>::
      ~vector((vector<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
               *)local_158);
      sVar26.pi_ = extraout_RDX;
      goto LAB_00154953;
    }
    if (EVar1 != etString) {
      pEVar23 = (Exception *)__cxa_allocate_exception(0x18);
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                 "Invalid Avro type: %1%");
      json::Entity::toString_abi_cxx11_(&local_1d8.ns_,e);
      local_230._8_8_ =
           boost::io::detail::call_put_head<char,std::char_traits<char>,std::__cxx11::string_const>;
      local_220._0_8_ =
           boost::io::detail::call_put_last<char,std::char_traits<char>,std::__cxx11::string_const>;
      local_230._0_8_ = &local_1d8;
      pbVar24 = boost::io::detail::
                feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                          ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_158,(put_holder<char,_std::char_traits<char>_> *)local_230);
      Exception::Exception(pEVar23,pbVar24);
      __cxa_throw(pEVar23,&Exception::typeinfo,Exception::~Exception);
    }
    json::Entity::ensureType(e,etString);
    psVar12 = boost::any_cast<boost::shared_ptr<std::__cxx11::string>>(&e->value_);
    psVar15 = psVar12->px;
    makePrimitive((avro *)&local_1f8,psVar15);
    psVar9 = local_1f8.attrs_.
             super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((element_type *)
        local_1f8.attrs_.
        super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (element_type *)0x0) {
      lVar16 = std::__cxx11::string::find((char)psVar15,0x2e);
      if (lVar16 == -1) {
        Name::Name(&local_1d8,psVar15,(string *)local_220._24_8_);
      }
      else {
        Name::Name(&local_1d8,psVar15);
      }
      iVar17 = std::
               _Rb_tree<avro::Name,_std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>,_std::_Select1st<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
               ::find(&st->_M_t,&local_1d8);
      if ((_Rb_tree_header *)iVar17._M_node == &(st->_M_t)._M_impl.super__Rb_tree_header) {
        pEVar23 = (Exception *)__cxa_allocate_exception(0x18);
        boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                  ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                   "Unknown type: %1%");
        Name::fullname_abi_cxx11_((string *)local_230,&local_1d8);
        local_178.put_head =
             boost::io::detail::
             call_put_head<char,std::char_traits<char>,std::__cxx11::string_const>;
        local_178.put_last =
             boost::io::detail::
             call_put_last<char,std::char_traits<char>,std::__cxx11::string_const>;
        local_178.arg = (_Base_ptr)local_230;
        pbVar24 = boost::io::detail::
                  feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_158,&local_178);
        Exception::Exception(pEVar23,pbVar24);
        __cxa_throw(pEVar23,&Exception::typeinfo,Exception::~Exception);
      }
      this_02 = (NodeSymbolic *)operator_new(0x68);
      asSingleAttribute<avro::Name>((SingleAttribute<avro::Name> *)local_158,&local_1d8);
      local_230._0_8_ = *(undefined8 *)(iVar17._M_node + 3);
      local_230._8_8_ = iVar17._M_node[3]._M_parent;
      if ((_Base_ptr)local_230._8_8_ != (_Base_ptr)0x0) {
        LOCK();
        *(int *)&((_Base_ptr)local_230._8_8_)->_M_parent =
             *(int *)&((_Base_ptr)local_230._8_8_)->_M_parent + 1;
        UNLOCK();
      }
      NodeSymbolic::NodeSymbolic(this_02,(HasName *)local_158,(NodePtr *)local_230);
      boost::shared_ptr<avro::Node>::shared_ptr<avro::NodeSymbolic>
                ((shared_ptr<avro::Node> *)local_220._16_8_,this_02);
      boost::detail::shared_count::~shared_count((shared_count *)(local_230 + 8));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_p != local_128) {
        operator_delete(local_138._M_p,local_128[0]._M_allocated_capacity + 1);
      }
      if ((NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
           *)local_158._0_8_ !=
          (NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
           *)local_148) {
        operator_delete((void *)local_158._0_8_,(ulong)(local_148._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8.simpleName_._M_dataplus._M_p != &local_1d8.simpleName_.field_2) {
        operator_delete(local_1d8.simpleName_._M_dataplus._M_p,
                        local_1d8.simpleName_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8.ns_._M_dataplus._M_p != &local_1d8.ns_.field_2) {
        operator_delete(local_1d8.ns_._M_dataplus._M_p,
                        local_1d8.ns_.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      *(pointer *)local_220._16_8_ =
           local_1f8.attrs_.
           super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)(local_220._16_8_ + 8) = 0;
      local_1f8.attrs_.
      super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      *(pointer *)(local_220._16_8_ + 8) = psVar9;
      local_1f8.attrs_.
      super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
    this_04 = &local_1f8.attrs_.
               super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  }
  boost::detail::shared_count::~shared_count((shared_count *)this_04);
  sVar26.pi_ = extraout_RDX_00;
LAB_00154953:
  NVar28.pn.pi_ = sVar26.pi_;
  NVar28.px = (element_type *)local_220._16_8_;
  return NVar28;
}

Assistant:

static NodePtr makeNode(const json::Entity& e, SymbolTable& st, const string& ns)
{
    switch (e.type()) {
    case json::etString:
        return makeNode(e.stringValue(), st, ns);
    case json::etObject:
        return makeNode(e, e.objectValue(), st, ns);
    case json::etArray:
        return makeNode(e, e.arrayValue(), st, ns);
    default:
        throw Exception(boost::format("Invalid Avro type: %1%") % e.toString());
    }
}